

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::errorRespondDelayedMessages(CommonCore *this,string_view estring)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *pAVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  optional<helics::ActionMessage> msg;
  char **in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int32_t in_stack_fffffffffffffdb4;
  value<fmt::v11::context> *in_stack_fffffffffffffdc0;
  SimpleQueue<helics::ActionMessage,_std::mutex> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe10;
  undefined1 local_160 [232];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop(in_stack_fffffffffffffde8);
  do {
    bVar1 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x54b19d);
    if (!bVar1) {
      std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x54b396);
      return;
    }
    pAVar3 = std::optional<helics::ActionMessage>::operator*
                       ((optional<helics::ActionMessage> *)0x54b1b3);
    aVar2 = ActionMessage::action(pAVar3);
    if (aVar2 == cmd_query) {
LAB_0054b1e0:
      in_stack_fffffffffffffda8 = &in_RDI[0x99]._M_str;
      pAVar3 = std::optional<helics::ActionMessage>::operator*
                         ((optional<helics::ActionMessage> *)0x54b1fc);
      in_stack_fffffffffffffdb4 = pAVar3->messageID;
      local_18 = local_160;
      local_28 = "#error:{}";
      uStack_20 = 9;
      local_30 = local_78;
      local_48 = "#error:{}";
      uStack_40 = 9;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                (in_stack_fffffffffffffdc0,in_RDI);
      local_8 = &local_58;
      local_10 = local_68;
      local_58 = 0xd;
      local_50 = local_10;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_00000020,(format_args)in_stack_00000010);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                        in_stack_fffffffffffffe00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    }
    else {
      pAVar3 = std::optional<helics::ActionMessage>::operator*
                         ((optional<helics::ActionMessage> *)0x54b1cf);
      aVar2 = ActionMessage::action(pAVar3);
      if (aVar2 == cmd_broker_query) goto LAB_0054b1e0;
    }
    gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop(in_stack_fffffffffffffde8)
    ;
    std::optional<helics::ActionMessage>::operator=
              ((optional<helics::ActionMessage> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (optional<helics::ActionMessage> *)in_stack_fffffffffffffda8);
    std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x54b384);
  } while( true );
}

Assistant:

void CommonCore::errorRespondDelayedMessages(std::string_view estring)
{
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        if ((*msg).action() == CMD_QUERY ||
            (*msg).action() == CMD_BROKER_QUERY) {  // deal with in flight queries that will block
                                                    // unless a response is given
            activeQueries.setDelayedValue((*msg).messageID, fmt::format("#error:{}", estring));
        }
        // else other message which might get into here shouldn't need any action, just drop them
        msg = delayTransmitQueue.pop();
    }
}